

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDA.cpp
# Opt level: O2

bool __thiscall PDA::addTransition(PDA *this,Transition *transition)

{
  bool bVar1;
  ostream *poVar2;
  Transition *local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  string local_80;
  string local_60;
  string local_40;
  
  local_a0 = transition;
  std::__cxx11::string::string((string *)&local_40,(string *)transition->stateFrom);
  bVar1 = containsState(this,&local_40);
  if (!bVar1) {
    bVar1 = false;
    goto LAB_00105296;
  }
  std::__cxx11::string::string((string *)&local_60,(string *)transition->stateTo);
  bVar1 = containsState(this,&local_60);
  if (bVar1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_98,&transition->stackPush);
    bVar1 = inStackAlphabet(this,&local_98);
    if (bVar1) {
      bVar1 = inAlphabet(this,transition->input);
      if (!bVar1) goto LAB_00105280;
      std::__cxx11::string::string((string *)&local_80,(string *)&transition->stackInput);
      bVar1 = inStackAlphabet(this,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
    }
    else {
LAB_00105280:
      bVar1 = false;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_98);
  }
  else {
    bVar1 = false;
  }
  std::__cxx11::string::~string((string *)&local_60);
LAB_00105296:
  std::__cxx11::string::~string((string *)&local_40);
  if (bVar1 == false) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Error adding transition");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  else {
    std::vector<Transition*,std::allocator<Transition*>>::emplace_back<Transition*&>
              ((vector<Transition*,std::allocator<Transition*>> *)&this->transitionFunctionD,
               &local_a0);
    State::addTransition(local_a0->stateFrom,local_a0);
  }
  return bVar1;
}

Assistant:

bool PDA::addTransition(Transition *transition) {
    if (containsState(transition->getStateFrom()->getName()) &&
        containsState(transition->getStateTo()->getName()) &&
        inStackAlphabet(transition->getStackPush()) &&
        inAlphabet(transition->getInput()) &&
        inStackAlphabet(transition->getStackInput())) {
        transitionFunctionD.emplace_back(transition);
        transition->getStateFrom()->addTransition(transition);
        return true;
    } else {
        std::cerr << "Error adding transition" << std::endl;
    }
    return false;
}